

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedElastic.test.cpp
# Opt level: O1

string * invalidChunk_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 2.936000+2 0.000000+0          1          0          1          2  27 7  2     \n          3          1                                              27 7  2     \n 1.059427-3 0.000000+0 3.718355-3 9.364524-3 4.237708-3 1.548925-2  27 7  2     \n 8.000000+2 0.000000+0          2          0          3          0  27 7  2     \n 5.000000-1 8.318414-3 1.640584-2                                   27 7  2     \n 2.054202+0 0.000000+0          0          0          1          6  27 7  2     \n          2          2                                              27 7  2     \n 2.936000+2 8.937898+0 8.000000+2 1.765328+1                        27 7  2     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string invalidChunk() {
  return
  " 2.936000+2 0.000000+0          1          0          1          2  27 7  2     \n"
  "          3          1                                              27 7  2     \n"
  " 1.059427-3 0.000000+0 3.718355-3 9.364524-3 4.237708-3 1.548925-2  27 7  2     \n"
  " 8.000000+2 0.000000+0          2          0          3          0  27 7  2     \n"
  " 5.000000-1 8.318414-3 1.640584-2                                   27 7  2     \n"
  " 2.054202+0 0.000000+0          0          0          1          6  27 7  2     \n"
  "          2          2                                              27 7  2     \n"
  " 2.936000+2 8.937898+0 8.000000+2 1.765328+1                        27 7  2     \n";
}